

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerManager.cpp
# Opt level: O1

void __thiscall ztimer::TimerManager::TimerManager(TimerManager *this)

{
  int iVar1;
  anon_class_1_0_00000001_for__M_head_impl *__f;
  thread *this_00;
  thread turnThread;
  long local_30;
  long *local_28;
  
  this->pin = 0;
  this->timeWheelPeriod = 1000;
  __f = (anon_class_1_0_00000001_for__M_head_impl *)0x3e8;
  std::
  vector<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>,_std::allocator<std::unordered_map<unsigned_long,_std::array<unsigned_int,_3UL>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::array<unsigned_int,_3UL>_>_>_>_>_>
  ::vector(&this->timeWheel,1000,(allocator_type *)&local_28);
  (this->timerMap)._M_h._M_buckets = &(this->timerMap)._M_h._M_single_bucket;
  (this->timerMap)._M_h._M_bucket_count = 1;
  (this->timerMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->timerMap)._M_h._M_element_count = 0;
  (this->timerMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->timerMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->timerMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->AbsTimerMap)._M_h._M_buckets = &(this->AbsTimerMap)._M_h._M_single_bucket;
  (this->AbsTimerMap)._M_h._M_bucket_count = 1;
  (this->AbsTimerMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->AbsTimerMap)._M_h._M_element_count = 0;
  (this->AbsTimerMap)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->AbsTimerMap)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->AbsTimerMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->mtx).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mtx).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mtx).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  if (StartTick()::tickThread == '\0') {
    this_00 = (thread *)&StartTick()::tickThread;
    iVar1 = __cxa_guard_acquire();
    if (iVar1 != 0) {
      std::thread::thread<ztimer::StartTick()::__0,,void>(this_00,__f);
      __cxa_atexit(std::thread::~thread,&StartTick()::tickThread,&__dso_handle);
      __cxa_guard_release(&StartTick()::tickThread);
    }
  }
  std::thread::detach();
  local_30 = 0;
  local_28 = (long *)operator_new(0x10);
  *local_28 = (long)&PTR___State_00136550;
  local_28[1] = (long)this;
  std::thread::_M_start_thread(&local_30,&local_28,0);
  if (local_28 != (long *)0x0) {
    (**(code **)(*local_28 + 8))();
  }
  std::thread::detach();
  if (local_30 == 0) {
    return;
  }
  std::terminate();
}

Assistant:

TimerManager::TimerManager() : pin(0), timeWheelPeriod(1000), timeWheel(timeWheelPeriod)
    {
        StartTick();
        std::thread turnThread([&]() {
            while (1) {
                {
                    std::unique_lock<std::mutex> lk(tickMtx);
                    cv.wait(lk, []() { return tick; });
                    tick = false;
                }
                std::lock_guard<std::mutex> lk(mtx);
                pin++;
                pin = (pin == timeWheelPeriod ? 0 : pin);
                Turn(pin);
            }
        });
        turnThread.detach();
    }